

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

_Bool * nvpair_get_bool_array(nvpair_t *nvp,size_t *nitems)

{
  char *__assertion;
  
  if (nvp == (nvpair_t *)0x0) {
    __assertion = "(nvp) != ((void*)0)";
  }
  else {
    if (nvp->nvp_magic == 0x6e7670) {
      if (nvp->nvp_type == 8) {
        if (nitems != (size_t *)0x0) {
          *nitems = nvp->nvp_nitems;
        }
        return (_Bool *)nvp->nvp_data;
      }
      __assert_fail("nvp->nvp_type == 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                    ,0x72c,"const _Bool *nvpair_get_bool_array(const nvpair_t *, size_t *)");
    }
    __assertion = "(nvp)->nvp_magic == 0x6e7670";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x72b,"const _Bool *nvpair_get_bool_array(const nvpair_t *, size_t *)");
}

Assistant:

const bool *
nvpair_get_bool_array(const nvpair_t *nvp, size_t *nitems)
{

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_BOOL_ARRAY);

	if (nitems != NULL)
		*nitems = nvp->nvp_nitems;

	return ((const bool *)(intptr_t)nvp->nvp_data);
}